

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O3

bool __thiscall chrono::ChSystem::DoEntireDynamics(ChSystem *this,double end_time)

{
  byte bVar1;
  int iVar2;
  
  if (this->is_initialized == false) {
    SetupInitial(this);
  }
  this->applied_forces_current = false;
  (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x3d])(this);
  DoAssembly(this,7);
  do {
    if (end_time <= this->ch_time) {
      bVar1 = this->last_err;
LAB_005211e9:
      bVar1 = bVar1 ^ 1;
      goto LAB_005211eb;
    }
    iVar2 = (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x43])(this);
    bVar1 = this->last_err;
    if ((char)iVar2 == '\0') goto LAB_005211e9;
  } while ((bVar1 & 1) == 0);
  bVar1 = 0;
LAB_005211eb:
  return (bool)(bVar1 & 1);
}

Assistant:

bool ChSystem::DoEntireDynamics(double end_time) {
    if (!is_initialized)
        SetupInitial();

    applied_forces_current = false;

    Setup();

    // the system may have wrong layout, or too large
    // clearances in constraints, so it is better to
    // check for constraint violation each time the integration starts
    DoAssembly(AssemblyLevel::POSITION | AssemblyLevel::VELOCITY | AssemblyLevel::ACCELERATION);

    // Perform the integration steps until the end
    // time is reached.
    // All the updating (of Y, Y_dt and time) is done
    // automatically by Integrate()

    while (ch_time < end_time) {
        if (!Integrate_Y())
            break;  // >>> 1- single integration step,
                    //        updating Y, from t to t+dt.
        if (last_err)
            return false;
    }

    if (last_err)
        return false;
    return true;
}